

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usrsubr.c
# Opt level: O1

int UserSubr(int user_subr_index,int num_args,uint *args)

{
  uint uVar1;
  ulong uVar2;
  
  printf("debug: case: 0x%x, args: 0x%x\n",user_subr_index,(ulong)(uint)num_args);
  if (0 < num_args) {
    uVar2 = 0;
    do {
      printf("debug: arg[%d]: 0x%x\n",uVar2 & 0xffffffff,(ulong)args[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)num_args != uVar2);
  }
  uVar1 = 0xffffffff;
  if (user_subr_index == 0) {
    puts("sample UFN");
    uVar1 = *args;
  }
  return uVar1;
}

Assistant:

int UserSubr(int user_subr_index, int num_args, unsigned *args) {
  int result = 0;

  /* *** remove the printf when finished debugging your user subr *** */

  printf("debug: case: 0x%x, args: 0x%x\n", user_subr_index, num_args);
  {
    int i;
    for (i = 0; i < num_args; i++) printf("debug: arg[%d]: 0x%x\n", i, args[i]);
  }

  switch (user_subr_index) {
    case 0:
      printf("sample UFN\n");
      result = args[0];
      break;
  default:
      return (-1); /* DO UFN */
  }

  return (result);
}